

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::make_string<>(lest *this,tuple<> *tuple)

{
  make_tuple_string<std::tuple<>,0ul> local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  tuple<> *local_18;
  tuple<> *tuple_local;
  
  local_18 = tuple;
  tuple_local = (tuple<> *)this;
  make_tuple_string<std::tuple<>,0ul>::make_abi_cxx11_(local_78,tuple);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"{ ");
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)local_78);
  return this;
}

Assistant:

auto make_string( std::tuple<TS...> const & tuple ) -> std::string
{
    return "{ " + make_tuple_string<std::tuple<TS...>, sizeof...(TS)>::make( tuple ) + "}";
}